

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite_test.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::FindFieldEntryTest_EmptyMessage_Test::TestBody
          (FindFieldEntryTest_EmptyMessage_Test *this)

{
  char *pcVar1;
  long lVar2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  uint32_t local_a8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_a0;
  AssertHelper local_98;
  TcParseTableBase local_90;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  char local_44 [20];
  
  lVar2 = 0;
  local_90.has_bits_offset = 0;
  local_90.extension_offset = 0;
  local_90.max_field_number = 0;
  local_90.fast_idx_mask = '\0';
  local_90._9_1_ = local_90._9_1_ & 0xfe;
  local_90.lookup_table_offset = 0x48;
  local_90.skipmap32 = 0xffffffff;
  local_90.field_entries_offset = 0x4c;
  local_90.num_field_entries = 0;
  local_90.num_aux_entries = 0;
  local_90.aux_offset = 0x4c;
  local_90.class_data = (ClassData *)0x0;
  local_90.post_loop_handler = (PostLoopHandler)0x0;
  local_90.fallback = (TailCallParseFunc)0x0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0xffffffff;
  local_44[0] = '\v';
  local_44[1] = '\0';
  local_44[2] = '\0';
  local_44[3] = '\0';
  local_44[4] = '\0';
  local_44[5] = '\0';
  local_44[6] = '\0';
  local_44[7] = '\0';
  local_44[8] = 'M';
  local_44[9] = 'e';
  local_44[10] = 's';
  local_44[0xb] = 's';
  local_44[0xc] = 'a';
  local_44[0xd] = 'g';
  local_44[0xe] = 'e';
  local_44[0xf] = 'N';
  local_44[0x10] = 'a';
  local_44[0x11] = 'm';
  local_44[0x12] = 'e';
  local_44[0x13] = '\0';
  local_a8[0] = 0;
  local_a8[1] = 4;
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0x1dcd650000000070;
  do {
    local_c0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_98.data_ =
         (AssertHelperData *)
         TcParser::FindFieldEntry(&local_90,*(uint32_t *)((long)local_a8 + lVar2));
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::EqMatcher<decltype(nullptr)>>::operator()
              (local_b8,(char *)&local_c0,(FieldEntry **)"FindFieldEntry(table, i)");
    if (local_b8[0] == '\0') {
      testing::Message::Message((Message *)&local_c0);
      pcVar1 = anon_var_dwarf_a12c75 + 5;
      if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = *(char **)local_b0;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite_test.cc"
                 ,0x26e,pcVar1);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if (local_c0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c0._M_head_impl + 8))();
      }
    }
    if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_b8 + 8),local_b0);
    }
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x10);
  local_c0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10e92ec;
  _local_b8 = TcParser::MessageName(&local_90);
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char_const*>>::
  operator()(local_a8,(char *)&local_c0,
             (basic_string_view<char,_std::char_traits<char>_> *)"MessageName(table)");
  if ((char)local_a8[0] == '\0') {
    testing::Message::Message((Message *)local_b8);
    if (pbStack_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (pbStack_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite_test.cc"
               ,0x270,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_b8 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_a0,pbStack_a0);
  }
  return;
}

Assistant:

TEST_F(FindFieldEntryTest, EmptyMessage) {
  // Ensure that tables with no fields are handled correctly.
  using TableType = TcParseTable<0, 0, 0, 20, 2>;
  // clang-format off
  TableType table = {
      // header:
      {
          0, 0,  // has_bits_offset, extensions
          0,     // max_field_number
          0,     // fast_idx_mask,
          offsetof(decltype(table), field_lookup_table),
          0xFFFFFFFF,       // no fields
          offsetof(decltype(table), field_names),  // no field_entries
          0,           // num_field_entries
          0,           // num_aux_entries
          offsetof(TableType, field_names),
          nullptr,     // default instance
          nullptr,     // post_loop_handler
          nullptr,     // fallback function
#ifdef PROTOBUF_PREFETCH_PARSE_TABLE
          nullptr,     // to_prefetch
#endif  // PROTOBUF_PREFETCH_PARSE_TABLE
      },
      {},  // fast_entries
      {{// empty field lookup table
        65535, 65535
      }},
      {{
          "\13\0\0\0\0\0\0\0"
          "MessageName"
      }},
  };
  // clang-format on

  for (int i : {0, 4, 112, 500000000}) {
    EXPECT_THAT(FindFieldEntry(table, i), Eq(nullptr));
  }
  EXPECT_THAT(MessageName(table), Eq("MessageName"));
}